

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEditBox.cpp
# Opt level: O3

void __thiscall irr::gui::CGUIEditBox::sendGuiEvent(CGUIEditBox *this,EGUI_EVENT_TYPE type)

{
  long *plVar1;
  SEvent e;
  undefined4 local_38 [2];
  CGUIEditBox *local_30;
  undefined8 local_28;
  EGUI_EVENT_TYPE local_20;
  
  plVar1 = *(long **)&this->field_0x20;
  if (plVar1 != (long *)0x0) {
    local_38[0] = 0;
    local_28 = 0;
    local_30 = this;
    local_20 = type;
    (**(code **)(*plVar1 + 0x10))(plVar1,local_38);
  }
  return;
}

Assistant:

void CGUIEditBox::sendGuiEvent(EGUI_EVENT_TYPE type)
{
	if (Parent) {
		SEvent e;
		e.EventType = EET_GUI_EVENT;
		e.GUIEvent.Caller = this;
		e.GUIEvent.Element = 0;
		e.GUIEvent.EventType = type;

		Parent->OnEvent(e);
	}
}